

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::enumAdjust
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,size_t n)

{
  uint uVar1;
  pointer pbVar2;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  _Elt_pointer pSVar6;
  ostringstream oss;
  string asStack_1b8 [32];
  ostream local_198;
  
  pSVar6 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar6 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar6 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar6[-1].kind_ != sEnumAdjust) {
    throwMismatch(sEnumAdjust,pSVar6[-1].kind_);
  }
  ppVar3 = boost::
           any_cast<std::pair<std::vector<int,std::allocator<int>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (&pSVar6[-1].extra_);
  assertLessThan(n,(long)(ppVar3->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(ppVar3->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  uVar1 = (ppVar3->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[n];
  if (-1 < (long)(int)uVar1) {
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parsingStack).c);
    return (long)(int)uVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>(&local_198,"Cannot resolve symbol: ",0x17);
  pbVar2 = (ppVar3->second).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&local_198,pbVar2[~uVar1]._M_dataplus._M_p,pbVar2[~uVar1]._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar4);
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error((runtime_error *)(puVar5 + 1),asStack_1b8);
  *puVar5 = 0x1cc910;
  puVar5[1] = 0x1cc940;
  __cxa_throw(puVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t enumAdjust(size_t n) {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sEnumAdjust, s.kind());
        const std::pair<std::vector<int>, std::vector<std::string> >* v =
            s.extrap<std::pair<std::vector<int>, std::vector<std::string> > >();
        assertLessThan(n, v->first.size());

        int result = v->first[n];
        if (result < 0) {
            std::ostringstream oss;
            oss << "Cannot resolve symbol: " << v->second[-result - 1]
                << std::endl;
            throw Exception(oss.str());
        }
        parsingStack.pop();
        return result;
    }